

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemIOCallback.cpp
# Opt level: O3

ssize_t __thiscall
libebml::MemIOCallback::read(MemIOCallback *this,int __fd,void *__buf,size_t __nbytes)

{
  uint64 uVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  void *__dest;
  
  __dest = (void *)CONCAT44(in_register_00000034,__fd);
  uVar2 = 0;
  if (__buf != (void *)0x0 && __dest != (void *)0x0) {
    uVar1 = this->dataBufferPos;
    if (this->dataBufferTotalSize < uVar1 + (long)__buf) {
      memcpy(__dest,this->dataBuffer + uVar1,this->dataBufferTotalSize - uVar1);
      uVar1 = this->dataBufferPos;
      this->dataBufferPos = this->dataBufferTotalSize;
      uVar2 = (ulong)(uint)((int)this->dataBufferTotalSize - (int)uVar1);
    }
    else {
      memcpy(__dest,this->dataBuffer + uVar1,(size_t)__buf);
      this->dataBufferPos = this->dataBufferPos + (long)__buf;
      uVar2 = (ulong)__buf & 0xffffffff;
    }
  }
  return uVar2;
}

Assistant:

uint32 MemIOCallback::read(void *Buffer, size_t Size)
{
  if (Buffer == NULL || Size < 1)
    return 0;
  //If the size is larger than than the amount left in the buffer
  if (Size + dataBufferPos > dataBufferTotalSize) {
    //We will only return the remaining data
    memcpy(Buffer, dataBuffer + dataBufferPos, dataBufferTotalSize - dataBufferPos);
    uint64 oldDataPos = dataBufferPos;
    dataBufferPos = dataBufferTotalSize;
    return dataBufferTotalSize - oldDataPos;
  }

  //Well... We made it here, so do a quick and simple copy
  memcpy(Buffer, dataBuffer+dataBufferPos, Size);
  dataBufferPos += Size;

  return Size;
}